

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

int Llb_CoreReachability(Llb_Img_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVStack_28;
  int RetValue;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  Vec_Ptr_t *vSupps;
  Llb_Img_t *p_local;
  
  vSupps = (Vec_Ptr_t *)p;
  if (p->pPars->fBackward == 0) {
    vQuant0 = Llb_ImgSupports(p->pAig,p->vDdMans,p->vVarsCs,p->vVarsNs,0,p->pPars->fVeryVerbose);
  }
  else {
    Vec_PtrReverseOrder(p->vDdMans);
    vQuant0 = Llb_ImgSupports((Aig_Man_t *)vSupps->pArray,*(Vec_Ptr_t **)(vSupps + 3),
                              *(Vec_Int_t **)(vSupps + 5),(Vec_Int_t *)vSupps[4].pArray,0,
                              *(int *)(*(long *)(vSupps + 1) + 0x44));
  }
  Llb_ImgSchedule(vQuant0,&vQuant1,&stack0xffffffffffffffd8,*(int *)(*(long *)(vSupps + 1) + 0x44));
  Vec_VecFree((Vec_Vec_t *)vQuant0);
  Llb_ImgQuantifyFirst
            ((Aig_Man_t *)vSupps->pArray,*(Vec_Ptr_t **)(vSupps + 3),vQuant1,
             *(int *)(*(long *)(vSupps + 1) + 0x44));
  iVar1 = Llb_CoreReachability_int((Llb_Img_t *)vSupps,vQuant1,pVStack_28);
  Vec_VecFree((Vec_Vec_t *)vQuant1);
  Vec_VecFree((Vec_Vec_t *)pVStack_28);
  return iVar1;
}

Assistant:

int Llb_CoreReachability( Llb_Img_t * p )
{
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    int RetValue;
    // get supports and quantified variables
    if ( p->pPars->fBackward )
    {
        Vec_PtrReverseOrder( p->vDdMans );
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 0, p->pPars->fVeryVerbose );
    }
    else
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsCs, p->vVarsNs, 0, p->pPars->fVeryVerbose );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, p->pPars->fVeryVerbose );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    // remove variables
    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0, p->pPars->fVeryVerbose );
    // perform reachability
    RetValue = Llb_CoreReachability_int( p, vQuant0, vQuant1 );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return RetValue;
}